

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O1

bool woff2::TransformGlyfAndLocaTables(Font *font)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out;
  uint uVar1;
  pointer puVar2;
  byte bVar3;
  byte bVar4;
  uint8_t *__src;
  mapped_type *pmVar5;
  bool bVar6;
  bool bVar7;
  short sVar8;
  uint uVar9;
  uint uVar10;
  Table *pTVar11;
  Table *this;
  uint uVar12;
  const_iterator __begin2;
  pointer pvVar13;
  uint uVar14;
  const_iterator __end2;
  byte bVar15;
  uint uVar16;
  short sVar17;
  int iVar18;
  short sVar19;
  short sVar20;
  Point *point;
  pointer pPVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  ulong uVar26;
  byte bVar27;
  GlyfEncoder encoder;
  Glyph glyph;
  size_t glyph_size;
  uint8_t *glyph_data;
  byte local_185;
  int local_184;
  undefined1 local_180 [24];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_168;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_150;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_138;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_120;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_108;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  uint local_c0;
  Glyph local_b8;
  mapped_type *local_78;
  mapped_type *local_70;
  ulong local_68;
  Font *local_60;
  ulong local_58;
  ulong local_50;
  long local_48;
  size_t local_40;
  uint8_t *local_38;
  
  pTVar11 = Font::FindTable(font,0x676c7966);
  this = Font::FindTable(font,0x6c6f6361);
  bVar6 = true;
  if (pTVar11 != (Table *)0x0 || this != (Table *)0x0) {
    if ((this == (Table *)0x0) == (pTVar11 == (Table *)0x0)) {
      bVar6 = Font::Table::IsReused(this);
      bVar7 = Font::Table::IsReused(pTVar11);
      if (bVar6 == bVar7) {
        bVar6 = Font::Table::IsReused(this);
        if (bVar6) {
          return true;
        }
        local_180._0_4_ = 0xe7ecf9e6;
        local_70 = std::
                   map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
                   ::operator[](&font->tables,(key_type *)local_180);
        local_180._0_4_ = 0xecefe3e1;
        local_78 = std::
                   map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
                   ::operator[](&font->tables,(key_type *)local_180);
        uVar9 = NumGlyphs(font);
        memset(local_180,0,0xc0);
        local_c0 = uVar9;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&local_120,(long)(int)((int)(uVar9 + 0x1f) >> 3 & 0xfffffffc));
        if (0 < (int)uVar9) {
          iVar18 = 0;
          local_68 = (ulong)uVar9;
          local_60 = font;
          do {
            local_b8.instructions_size = 0;
            local_b8.contours.
            super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_b8.contours.
            super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_b8.contours.
            super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_b8.composite_data_size = 0;
            local_184 = iVar18;
            bVar6 = GetGlyphData(local_60,iVar18,&local_38,&local_40);
            if ((!bVar6) ||
               ((local_40 != 0 && (bVar6 = ReadGlyph(local_38,local_40,&local_b8), !bVar6)))) {
              std::
              vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
              ::~vector(&local_b8.contours);
              goto LAB_0010a1d6;
            }
            if (local_b8.composite_data_size == 0) {
              if ((long)local_b8.contours.
                        super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_b8.contours.
                        super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start == 0) {
                anon_unknown_2::WriteUShort
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_180,0);
                goto LAB_0010a010;
              }
              uVar9 = (int)((long)local_b8.contours.
                                  super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_b8.contours.
                                  super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x55555555;
              anon_unknown_2::WriteUShort
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_180,uVar9);
              if ((local_b8.contours.
                   super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start ==
                   local_b8.contours.
                   super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) ||
                 (pPVar21 = ((local_b8.contours.
                              super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                            )._M_impl.super__Vector_impl_data._M_start,
                 pPVar21 ==
                 ((local_b8.contours.
                   super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>).
                 _M_impl.super__Vector_impl_data._M_finish)) {
                if ((local_b8.x_min == 0) && ((local_b8.y_min == 0 && (local_b8.x_max == 0)))) {
                  sVar8 = 0;
                  goto LAB_00109a48;
                }
LAB_00109a52:
                anon_unknown_2::GlyfEncoder::WriteBbox((GlyfEncoder *)local_180,local_184,&local_b8)
                ;
              }
              else {
                uVar12 = (uint)(ushort)pPVar21->x;
                uVar16 = (uint)(ushort)pPVar21->y;
                pvVar13 = local_b8.contours.
                          super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                uVar14 = uVar12;
                uVar10 = uVar16;
                do {
                  pPVar21 = (pvVar13->
                            super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  while( true ) {
                    sVar8 = (short)uVar10;
                    sVar20 = (short)uVar12;
                    sVar17 = (short)uVar14;
                    sVar19 = (short)uVar16;
                    if (pPVar21 ==
                        (pvVar13->
                        super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                        )._M_impl.super__Vector_impl_data._M_finish) break;
                    uVar16 = pPVar21->x;
                    uVar1 = pPVar21->y;
                    uVar12 = (int)sVar20;
                    if ((int)uVar16 < (int)sVar20) {
                      uVar12 = uVar16;
                    }
                    uVar14 = (int)sVar17;
                    if ((int)sVar17 < (int)uVar16) {
                      uVar14 = uVar16;
                    }
                    uVar16 = (int)sVar19;
                    if ((int)uVar1 < (int)sVar19) {
                      uVar16 = uVar1;
                    }
                    uVar10 = (int)sVar8;
                    if ((int)sVar8 < (int)uVar1) {
                      uVar10 = uVar1;
                    }
                    pPVar21 = pPVar21 + 1;
                  }
                  pvVar13 = pvVar13 + 1;
                } while (pvVar13 !=
                         local_b8.contours.
                         super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
                if (((local_b8.x_min != sVar20) || (local_b8.y_min != sVar19)) ||
                   (local_b8.x_max != sVar17)) goto LAB_00109a52;
LAB_00109a48:
                if (local_b8.y_max != sVar8) goto LAB_00109a52;
              }
              if (0 < (int)uVar9) {
                lVar25 = 8;
                uVar26 = (ulong)(uVar9 & 0x7fffffff);
                do {
                  woff2::Write255UShort
                            ((vector *)&local_168,
                             (int)((ulong)(*(long *)((long)&((local_b8.contours.
                                                                                                                            
                                                  super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  lVar25) -
                                          *(long *)((long)local_b8.contours.
                                                                                                                    
                                                  super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                                  lVar25 + -8)) >> 2) * -0x55555555);
                  lVar25 = lVar25 + 0x18;
                  uVar26 = uVar26 - 1;
                } while (uVar26 != 0);
                uVar26 = 0;
                iVar18 = 0;
                iVar23 = 0;
                local_58 = (ulong)(uVar9 & 0x7fffffff);
                do {
                  local_48 = uVar26 * 3;
                  uVar9 = (int)((long)local_b8.contours.
                                      super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar26].
                                      super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_b8.contours.
                                      super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar26].
                                      super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x55555555;
                  local_50 = uVar26;
                  if (0 < (int)uVar9) {
                    uVar26 = (ulong)(uVar9 & 0x7fffffff);
                    lVar25 = 8;
                    iVar22 = iVar23;
                    iVar24 = iVar18;
                    do {
                      pPVar21 = (&((local_b8.contours.
                                    super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                                  )._M_impl.super__Vector_impl_data._M_start)[local_48];
                      iVar18 = *(int *)((long)pPVar21 + lVar25 + -8);
                      iVar23 = *(int *)((long)pPVar21 + lVar25 + -4);
                      uVar12 = iVar23 - iVar22;
                      uVar14 = iVar18 - iVar24;
                      uVar9 = -uVar14;
                      if (0 < (int)uVar14) {
                        uVar9 = uVar14;
                      }
                      uVar16 = -uVar12;
                      if (0 < (int)uVar12) {
                        uVar16 = uVar12;
                      }
                      local_185 = (*(byte *)((long)&pPVar21->x + lVar25) ^ 1) * -0x80;
                      bVar3 = ~(byte)(uVar12 >> 0x18);
                      bVar15 = (byte)uVar16;
                      if ((iVar18 == iVar24) && (uVar16 < 0x500)) {
                        local_185 = (byte)(uVar16 >> 7) & 0xe | bVar3 >> 7 | local_185;
                        if (local_150.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish ==
                            local_150.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                          _M_realloc_insert<unsigned_char>
                                    (&local_150,
                                     (iterator)
                                     local_150.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,&local_185);
                        }
                        else {
                          *local_150.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish = local_185;
                          local_150.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish =
                               local_150.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 1;
                        }
                        local_185 = bVar15;
                        if (local_f0.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish !=
                            local_f0.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_00109c48;
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                        _M_realloc_insert<unsigned_char>
                                  (&local_f0,
                                   (iterator)
                                   local_f0.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,&local_185);
                      }
                      else {
                        bVar4 = ~(byte)(uVar14 >> 0x18);
                        bVar27 = (byte)uVar9;
                        if ((iVar23 == iVar22) && (uVar9 < 0x500)) {
                          local_185 = ((byte)(uVar9 >> 7) & 0xe | bVar4 >> 7) + local_185 + 10;
                          if (local_150.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish ==
                              local_150.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage) {
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                            _M_realloc_insert<unsigned_char>
                                      (&local_150,
                                       (iterator)
                                       local_150.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish,&local_185);
                          }
                          else {
                            *local_150.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish = local_185;
                            local_150.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish =
                                 local_150.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish + 1;
                          }
                          if (local_f0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish ==
                              local_f0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage) {
                            local_185 = bVar27;
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                            _M_realloc_insert<unsigned_char>
                                      (&local_f0,
                                       (iterator)
                                       local_f0.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish,&local_185);
                          }
                          else {
                            *local_f0.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish = bVar27;
                            local_185 = bVar27;
LAB_00109cea:
                            local_f0.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish =
                                 local_f0.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish + 1;
                          }
                        }
                        else {
                          bVar3 = ((char)bVar3 >> 7) * -2 - ((char)bVar4 >> 7);
                          if ((uVar9 < 0x41) && (uVar16 < 0x41)) {
                            local_185 = ((byte)(uVar16 - 1 >> 2) & 0xc) +
                                        local_185 + bVar3 + ((byte)(uVar9 - 1) & 0x30) + 0x14;
                            if (local_150.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish ==
                                local_150.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage) {
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                              _M_realloc_insert<unsigned_char>
                                        (&local_150,
                                         (iterator)
                                         local_150.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish,&local_185);
                            }
                            else {
                              *local_150.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish = local_185;
                              local_150.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish =
                                   local_150.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + 1;
                            }
                            uVar16 = uVar16 - 1 & 0xf | (uVar9 - 1) * 0x10;
                            local_185 = (byte)uVar16;
                            if (local_f0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish !=
                                local_f0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage)
                            goto LAB_00109c48;
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                            _M_realloc_insert<unsigned_char>
                                      (&local_f0,
                                       (iterator)
                                       local_f0.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish,&local_185);
                          }
                          else if ((uVar9 < 0x301) && (uVar16 < 0x301)) {
                            uVar16 = uVar16 - 1;
                            local_185 = (local_185 | bVar3) + ((byte)(uVar9 - 1 >> 8) & 3) * '\f' +
                                        ((byte)(uVar16 >> 6) & 0xc) + 0x54;
                            if (local_150.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish ==
                                local_150.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage) {
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                              _M_realloc_insert<unsigned_char>
                                        (&local_150,
                                         (iterator)
                                         local_150.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish,&local_185);
                            }
                            else {
                              *local_150.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish = local_185;
                              local_150.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish =
                                   local_150.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + 1;
                            }
                            local_185 = (byte)(uVar9 - 1);
                            if (local_f0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish ==
                                local_f0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage) {
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                              _M_realloc_insert<unsigned_char>
                                        (&local_f0,
                                         (iterator)
                                         local_f0.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish,&local_185);
                            }
                            else {
                              *local_f0.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish = local_185;
                              local_f0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish =
                                   local_f0.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + 1;
                            }
                            local_185 = (byte)uVar16;
                            if (local_f0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish !=
                                local_f0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage)
                            goto LAB_00109c48;
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                            _M_realloc_insert<unsigned_char>
                                      (&local_f0,
                                       (iterator)
                                       local_f0.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish,&local_185);
                          }
                          else {
                            bVar4 = (byte)(uVar16 >> 8);
                            if ((uVar9 < 0x1000) && (uVar16 < 0x1000)) {
                              local_185 = bVar3 | local_185 | 0x78;
                              if (local_150.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish ==
                                  local_150.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                _M_realloc_insert<unsigned_char>
                                          (&local_150,
                                           (iterator)
                                           local_150.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_finish,&local_185);
                              }
                              else {
                                *local_150.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish = local_185;
                                local_150.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish =
                                     local_150.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + 1;
                              }
                              local_185 = (byte)(uVar9 >> 4);
                              if (local_f0.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish ==
                                  local_f0.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                _M_realloc_insert<unsigned_char>
                                          (&local_f0,
                                           (iterator)
                                           local_f0.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_finish,&local_185);
                              }
                              else {
                                *local_f0.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish = local_185;
                                local_f0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish =
                                     local_f0.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + 1;
                              }
                              local_185 = bVar4 | (byte)(uVar9 << 4);
                              if (local_f0.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish ==
                                  local_f0.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                _M_realloc_insert<unsigned_char>
                                          (&local_f0,
                                           (iterator)
                                           local_f0.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_finish,&local_185);
                              }
                              else {
                                *local_f0.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish = local_185;
                                local_f0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish =
                                     local_f0.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + 1;
                              }
                              local_185 = bVar15;
                              if (local_f0.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish !=
                                  local_f0.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
LAB_00109c48:
                                *local_f0.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish = (uchar)uVar16;
                                goto LAB_00109cea;
                              }
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                              _M_realloc_insert<unsigned_char>
                                        (&local_f0,
                                         (iterator)
                                         local_f0.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish,&local_185);
                            }
                            else {
                              local_185 = bVar3 | local_185 | 0x7c;
                              if (local_150.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish ==
                                  local_150.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                _M_realloc_insert<unsigned_char>
                                          (&local_150,
                                           (iterator)
                                           local_150.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_finish,&local_185);
                              }
                              else {
                                *local_150.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish = local_185;
                                local_150.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish =
                                     local_150.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + 1;
                              }
                              local_185 = (byte)(uVar9 >> 8);
                              if (local_f0.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish ==
                                  local_f0.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                _M_realloc_insert<unsigned_char>
                                          (&local_f0,
                                           (iterator)
                                           local_f0.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_finish,&local_185);
                              }
                              else {
                                *local_f0.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish = local_185;
                                local_f0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish =
                                     local_f0.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + 1;
                              }
                              if (local_f0.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish ==
                                  local_f0.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                                local_185 = bVar27;
                                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                _M_realloc_insert<unsigned_char>
                                          (&local_f0,
                                           (iterator)
                                           local_f0.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_finish,&local_185);
                              }
                              else {
                                *local_f0.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish = bVar27;
                                local_f0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish =
                                     local_f0.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + 1;
                              }
                              if (local_f0.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish ==
                                  local_f0.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                                local_185 = bVar4;
                                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                _M_realloc_insert<unsigned_char>
                                          (&local_f0,
                                           (iterator)
                                           local_f0.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_finish,&local_185);
                              }
                              else {
                                *local_f0.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish = bVar4;
                                local_f0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish =
                                     local_f0.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + 1;
                              }
                              local_185 = bVar15;
                              if (local_f0.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish !=
                                  local_f0.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                              goto LAB_00109c48;
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                              _M_realloc_insert<unsigned_char>
                                        (&local_f0,
                                         (iterator)
                                         local_f0.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish,&local_185);
                            }
                          }
                        }
                      }
                      lVar25 = lVar25 + 0xc;
                      uVar26 = uVar26 - 1;
                      iVar22 = iVar23;
                      iVar24 = iVar18;
                    } while (uVar26 != 0);
                  }
                  uVar26 = local_50 + 1;
                } while (uVar26 != local_58);
                goto LAB_00109ff0;
              }
            }
            else {
              anon_unknown_2::WriteUShort
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_180,-1);
              anon_unknown_2::GlyfEncoder::WriteBbox((GlyfEncoder *)local_180,local_184,&local_b8);
              __src = local_b8.composite_data;
              uVar26 = (ulong)local_b8.composite_data_size;
              if (uVar26 != 0) {
                lVar25 = CONCAT44(local_138.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                  (int)local_138.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish) -
                         CONCAT44(local_138.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (int)local_138.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_138,uVar26 + lVar25);
                memcpy((void *)(lVar25 + CONCAT44(local_138.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  (int)local_138.
                                                                                                              
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)),__src,
                       uVar26);
              }
              if (local_b8.have_instructions != false) {
LAB_00109ff0:
                anon_unknown_2::GlyfEncoder::WriteInstructions((GlyfEncoder *)local_180,&local_b8);
              }
            }
LAB_0010a010:
            std::
            vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
            ::~vector(&local_b8.contours);
            iVar18 = local_184 + 1;
            font = local_60;
          } while (iVar18 != (int)local_68);
        }
        pmVar5 = local_70;
        out = &local_70->buffer;
        anon_unknown_2::WriteLong(out,0);
        anon_unknown_2::WriteUShort(out,local_c0);
        anon_unknown_2::WriteUShort(out,0);
        anon_unknown_2::WriteLong(out,local_180._8_4_ - local_180._0_4_);
        anon_unknown_2::WriteLong
                  (out,(int)local_168.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                       (int)local_168.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
        anon_unknown_2::WriteLong
                  (out,(int)local_150.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                       (int)local_150.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
        anon_unknown_2::WriteLong
                  (out,(int)local_f0.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                       (int)local_f0.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
        anon_unknown_2::WriteLong
                  (out,(int)local_138.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                       (int)local_138.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
        anon_unknown_2::WriteLong
                  (out,((int)local_120.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish +
                       (int)local_108.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish) -
                       ((int)local_120.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start +
                       (int)local_108.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start));
        anon_unknown_2::WriteLong
                  (out,(int)local_d8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                       (int)local_d8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
        anon_unknown_2::WriteBytes
                  (out,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_180);
        anon_unknown_2::WriteBytes(out,&local_168);
        anon_unknown_2::WriteBytes(out,&local_150);
        anon_unknown_2::WriteBytes(out,&local_f0);
        anon_unknown_2::WriteBytes(out,&local_138);
        anon_unknown_2::WriteBytes(out,&local_120);
        anon_unknown_2::WriteBytes(out,&local_108);
        anon_unknown_2::WriteBytes(out,&local_d8);
        pTVar11 = Font::FindTable(font,0x68656164);
        if ((pTVar11 == (Table *)0x0) || (pTVar11->length < 0x34)) {
LAB_0010a1d6:
          bVar6 = false;
        }
        else {
          (pmVar5->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_start[7] = pTVar11->data[0x33];
          pmVar5->tag = 0xe7ecf9e6;
          puVar2 = (pmVar5->buffer).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pmVar5->length =
               *(int *)&(pmVar5->buffer).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish - (int)puVar2;
          pmVar5->data = puVar2;
          local_78->tag = 0xecefe3e1;
          local_78->length = 0;
          local_78->data = (uint8_t *)0x0;
          bVar6 = true;
        }
        anon_unknown_2::GlyfEncoder::~GlyfEncoder((GlyfEncoder *)local_180);
        return bVar6;
      }
    }
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool TransformGlyfAndLocaTables(Font* font) {
  // no transform for CFF
  const Font::Table* glyf_table = font->FindTable(kGlyfTableTag);
  const Font::Table* loca_table = font->FindTable(kLocaTableTag);

  // If you don't have glyf/loca this transform isn't very interesting
  if (loca_table == NULL && glyf_table == NULL) {
    return true;
  }
  // It would be best if you didn't have just one of glyf/loca
  if ((glyf_table == NULL) != (loca_table == NULL)) {
    return FONT_COMPRESSION_FAILURE();
  }
  // Must share neither or both loca & glyf
  if (loca_table->IsReused() != glyf_table->IsReused()) {
    return FONT_COMPRESSION_FAILURE();
  }
  if (loca_table->IsReused()) {
    return true;
  }

  Font::Table* transformed_glyf = &font->tables[kGlyfTableTag ^ 0x80808080];
  Font::Table* transformed_loca = &font->tables[kLocaTableTag ^ 0x80808080];

  int num_glyphs = NumGlyphs(*font);
  GlyfEncoder encoder(num_glyphs);
  for (int i = 0; i < num_glyphs; ++i) {
    Glyph glyph;
    const uint8_t* glyph_data;
    size_t glyph_size;
    if (!GetGlyphData(*font, i, &glyph_data, &glyph_size) ||
        (glyph_size > 0 && !ReadGlyph(glyph_data, glyph_size, &glyph))) {
      return FONT_COMPRESSION_FAILURE();
    }
    encoder.Encode(i, glyph);
  }
  encoder.GetTransformedGlyfBytes(&transformed_glyf->buffer);

  const Font::Table* head_table = font->FindTable(kHeadTableTag);
  if (head_table == NULL || head_table->length < 52) {
    return FONT_COMPRESSION_FAILURE();
  }
  transformed_glyf->buffer[7] = head_table->data[51];  // index_format

  transformed_glyf->tag = kGlyfTableTag ^ 0x80808080;
  transformed_glyf->length = transformed_glyf->buffer.size();
  transformed_glyf->data = transformed_glyf->buffer.data();

  transformed_loca->tag = kLocaTableTag ^ 0x80808080;
  transformed_loca->length = 0;
  transformed_loca->data = NULL;

  return true;
}